

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O1

void __thiscall pmx::PmxModel::Read(PmxModel *this,istream *stream)

{
  PmxSetting *this_00;
  int *piVar1;
  float fVar2;
  PmxVertex *__ptr_00;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_01;
  PmxMaterial *__ptr_02;
  PmxBone *__ptr_03;
  PmxMorph *__ptr_04;
  PmxFrame *__ptr_05;
  PmxRigidBody *__ptr_06;
  PmxJoint *__ptr_07;
  undefined8 uVar4;
  int iVar5;
  int *__s;
  ostream *poVar6;
  runtime_error *prVar7;
  uint8_t in_CL;
  undefined8 uVar8;
  pointer *__ptr;
  long lVar9;
  ulong __n;
  default_delete<std::__cxx11::string[]> *this_01;
  long lVar10;
  char magic [4];
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int *local_58;
  string local_50;
  
  std::istream::read((char *)stream,(long)&local_68 + 0xc);
  if ((((local_68._M_local_buf[0xc] == 'P') && (local_68._M_local_buf[0xd] == 'M')) &&
      (local_68._M_local_buf[0xe] == 'X')) && (local_68._M_local_buf[0xf] == ' ')) {
    std::istream::read((char *)stream,(long)this);
    fVar2 = this->version;
    if (((fVar2 != 2.0) || (NAN(fVar2))) && ((fVar2 != 2.1 || (NAN(fVar2))))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"this is not ver2.0 or ver2.1 but ",0x21);
      poVar6 = std::ostream::_M_insert<double>((double)this->version);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
      std::endl<char,std::char_traits<char>>(poVar6);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<float>(&local_50,this->version);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     "MMD: this is not ver2.0 or ver2.1 but ",&local_50);
      std::runtime_error::runtime_error(prVar7,(string *)local_88);
      *(undefined ***)prVar7 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = &this->setting;
    PmxSetting::Read(this_00,stream);
    ReadString_abi_cxx11_
              ((string *)local_88,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_name,(string *)local_88);
    if ((PmxVertex *)local_88._0_8_ != (PmxVertex *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    ReadString_abi_cxx11_
              ((string *)local_88,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_english_name,(string *)local_88);
    if ((PmxVertex *)local_88._0_8_ != (PmxVertex *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    ReadString_abi_cxx11_
              ((string *)local_88,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_comment,(string *)local_88);
    if ((PmxVertex *)local_88._0_8_ != (PmxVertex *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    ReadString_abi_cxx11_
              ((string *)local_88,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
    std::__cxx11::string::operator=((string *)&this->model_english_comment,(string *)local_88);
    if ((PmxVertex *)local_88._0_8_ != (PmxVertex *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    piVar1 = &this->vertex_count;
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxVertex[]>((mmd *)local_88,(long)this->vertex_count);
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxVertex *)0x0;
    __ptr_00 = (this->vertices)._M_t.
               super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
               super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
    (this->vertices)._M_t.
    super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
    super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl = (PmxVertex *)uVar8;
    local_68._M_allocated_capacity = (size_type)this;
    if (__ptr_00 != (PmxVertex *)0x0) {
      std::default_delete<pmx::PmxVertex[]>::operator()
                ((default_delete<pmx::PmxVertex[]> *)&this->vertices,__ptr_00);
    }
    if ((PmxVertex *)local_88._0_8_ != (PmxVertex *)0x0) {
      std::default_delete<pmx::PmxVertex[]>::operator()
                ((default_delete<pmx::PmxVertex[]> *)local_88,(PmxVertex *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxVertex::Read((PmxVertex *)
                        ((long)((this->vertices)._M_t.
                                super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>
                                .super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl)->
                               position + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x78;
      } while (lVar9 < *piVar1);
    }
    uVar8 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0xa0);
    std::istream::read((char *)stream,(long)piVar1);
    __n = 0xffffffffffffffff;
    if (-1 < (long)*(int *)(uVar8 + 0xa0)) {
      __n = (long)*(int *)(uVar8 + 0xa0) * 4;
    }
    __s = (int *)operator_new__(__n);
    memset(__s,0,__n);
    piVar3 = (((unique_ptr<int[],_std::default_delete<int[]>_> *)(uVar8 + 0xa8))->_M_t).
             super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (((unique_ptr<int[],_std::default_delete<int[]>_> *)(uVar8 + 0xa8))->_M_t).
    super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = __s;
    if (piVar3 != (int *)0x0) {
      operator_delete__(piVar3);
    }
    if (0 < *piVar1) {
      lVar9 = 0;
      do {
        iVar5 = ReadIndex(stream,(uint)*(uint8_t *)(uVar8 + 6));
        (((unique_ptr<int[],_std::default_delete<int[]>_> *)(uVar8 + 0xa8))->_M_t).
        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar9] = iVar5;
        lVar9 = lVar9 + 1;
      } while (lVar9 < *(int *)(uVar8 + 0xa0));
    }
    local_58 = (int *)(uVar8 + 0xb0);
    std::istream::read((char *)stream,(long)local_58);
    mmd::make_unique<std::__cxx11::string[]>((mmd *)local_88,(long)*(int *)(uVar8 + 0xb0));
    uVar4 = local_88._0_8_;
    this_01 = (default_delete<std::__cxx11::string[]> *)(uVar8 + 0xb8);
    local_88._0_8_ = (PmxMaterial *)0x0;
    __ptr_01 = (((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                  *)(uVar8 + 0xb8))->_M_t).
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    (((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
       *)(uVar8 + 0xb8))->_M_t).
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar4;
    if (__ptr_01 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::default_delete<std::__cxx11::string[]>::operator()(this_01,__ptr_01);
    }
    if ((PmxMaterial *)local_88._0_8_ != (PmxMaterial *)0x0) {
      std::default_delete<std::__cxx11::string[]>::operator()
                ((default_delete<std::__cxx11::string[]> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_
                );
    }
    if (0 < *local_58) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        ReadString_abi_cxx11_
                  ((string *)local_88,(pmx *)stream,(istream *)(ulong)this_00->encoding,
                   (uint8_t)uVar8);
        std::__cxx11::string::operator=((string *)(*(long *)this_01 + lVar10),(string *)local_88);
        if ((PmxMaterial *)local_88._0_8_ != (PmxMaterial *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_);
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar9 < *local_58);
    }
    uVar4 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0xc0);
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxMaterial[]>((mmd *)local_88,(long)*(int *)(uVar4 + 0xc0));
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxMaterial *)0x0;
    __ptr_02 = (((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)
                (uVar4 + 200))->_M_t).
               super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
               super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl;
    (((unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_> *)(uVar4 + 200))->
    _M_t).super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
    super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl = (PmxMaterial *)uVar8;
    if (__ptr_02 != (PmxMaterial *)0x0) {
      std::default_delete<pmx::PmxMaterial[]>::operator()
                ((default_delete<pmx::PmxMaterial[]> *)(uVar4 + 200),__ptr_02);
    }
    if ((PmxMaterial *)local_88._0_8_ != (PmxMaterial *)0x0) {
      std::default_delete<pmx::PmxMaterial[]>::operator()
                ((default_delete<pmx::PmxMaterial[]> *)local_88,(PmxMaterial *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxMaterial::Read((PmxMaterial *)(*(long *)(uVar4 + 200) + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0xc0;
      } while (lVar9 < *piVar1);
    }
    uVar4 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0xd0);
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxBone[]>((mmd *)local_88,(long)*(int *)(uVar4 + 0xd0));
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxBone *)0x0;
    __ptr_03 = (((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)(uVar4 + 0xd8))
               ->_M_t).super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>.
               _M_t.super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
               super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
    (((unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_> *)(uVar4 + 0xd8))->_M_t).
    super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
    super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl = (PmxBone *)uVar8;
    if (__ptr_03 != (PmxBone *)0x0) {
      std::default_delete<pmx::PmxBone[]>::operator()
                ((default_delete<pmx::PmxBone[]> *)(uVar4 + 0xd8),__ptr_03);
    }
    if ((PmxBone *)local_88._0_8_ != (PmxBone *)0x0) {
      std::default_delete<pmx::PmxBone[]>::operator()
                ((default_delete<pmx::PmxBone[]> *)local_88,(PmxBone *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxBone::Read((PmxBone *)(*(long *)(uVar4 + 0xd8) + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0xb0;
      } while (lVar9 < *piVar1);
    }
    uVar4 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0xe0);
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxMorph[]>((mmd *)local_88,(long)*(int *)(uVar4 + 0xe0));
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxMorph *)0x0;
    __ptr_04 = (((unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)
                (uVar4 + 0xe8))->_M_t).
               super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
               super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl;
    (((unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_> *)(uVar4 + 0xe8))->_M_t).
    super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
    super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl = (PmxMorph *)uVar8;
    if (__ptr_04 != (PmxMorph *)0x0) {
      std::default_delete<pmx::PmxMorph[]>::operator()
                ((default_delete<pmx::PmxMorph[]> *)(uVar4 + 0xe8),__ptr_04);
    }
    if ((PmxMorph *)local_88._0_8_ != (PmxMorph *)0x0) {
      std::default_delete<pmx::PmxMorph[]>::operator()
                ((default_delete<pmx::PmxMorph[]> *)local_88,(PmxMorph *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxMorph::Read((PmxMorph *)(*(long *)(uVar4 + 0xe8) + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x80;
      } while (lVar9 < *piVar1);
    }
    uVar4 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0xf0);
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxFrame[]>((mmd *)local_88,(long)*(int *)(uVar4 + 0xf0));
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxRigidBody *)0x0;
    __ptr_05 = (((unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)
                (uVar4 + 0xf8))->_M_t).
               super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
               super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl;
    (((unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_> *)(uVar4 + 0xf8))->_M_t).
    super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
    super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl = (PmxFrame *)uVar8;
    if (__ptr_05 != (PmxFrame *)0x0) {
      std::default_delete<pmx::PmxFrame[]>::operator()
                ((default_delete<pmx::PmxFrame[]> *)(uVar4 + 0xf8),__ptr_05);
    }
    if ((PmxRigidBody *)local_88._0_8_ != (PmxRigidBody *)0x0) {
      std::default_delete<pmx::PmxFrame[]>::operator()
                ((default_delete<pmx::PmxFrame[]> *)local_88,(PmxFrame *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxFrame::Read((PmxFrame *)(*(long *)(uVar4 + 0xf8) + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x50;
      } while (lVar9 < *piVar1);
    }
    uVar4 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0x100);
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxRigidBody[]>((mmd *)local_88,(long)*(int *)(uVar4 + 0x100));
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxJoint *)0x0;
    __ptr_06 = (((unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)
                (uVar4 + 0x108))->_M_t).
               super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>
               .super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl;
    (((unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_> *)(uVar4 + 0x108))
    ->_M_t).super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>._M_t
    .super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
    super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl = (PmxRigidBody *)uVar8;
    if (__ptr_06 != (PmxRigidBody *)0x0) {
      std::default_delete<pmx::PmxRigidBody[]>::operator()
                ((default_delete<pmx::PmxRigidBody[]> *)(uVar4 + 0x108),__ptr_06);
    }
    if ((PmxJoint *)local_88._0_8_ != (PmxJoint *)0x0) {
      std::default_delete<pmx::PmxRigidBody[]>::operator()
                ((default_delete<pmx::PmxRigidBody[]> *)local_88,(PmxRigidBody *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxRigidBody::Read((PmxRigidBody *)(*(long *)(uVar4 + 0x108) + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x88;
      } while (lVar9 < *piVar1);
    }
    uVar4 = local_68._M_allocated_capacity;
    piVar1 = (int *)(local_68._M_allocated_capacity + 0x110);
    std::istream::read((char *)stream,(long)piVar1);
    mmd::make_unique<pmx::PmxJoint[]>((mmd *)local_88,(long)*(int *)(uVar4 + 0x110));
    uVar8 = local_88._0_8_;
    local_88._0_8_ = (PmxJoint *)0x0;
    __ptr_07 = (((unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)
                (uVar4 + 0x118))->_M_t).
               super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
               super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl;
    (((unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_> *)(uVar4 + 0x118))->_M_t).
    super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
    super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl = (PmxJoint *)uVar8;
    if (__ptr_07 != (PmxJoint *)0x0) {
      std::default_delete<pmx::PmxJoint[]>::operator()
                ((default_delete<pmx::PmxJoint[]> *)(uVar4 + 0x118),__ptr_07);
    }
    if ((PmxJoint *)local_88._0_8_ != (PmxJoint *)0x0) {
      std::default_delete<pmx::PmxJoint[]>::operator()
                ((default_delete<pmx::PmxJoint[]> *)local_88,(PmxJoint *)local_88._0_8_);
    }
    if (0 < *piVar1) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        PmxJoint::Read((PmxJoint *)(*(long *)(uVar4 + 0x118) + lVar10),stream,this_00);
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0xb0;
      } while (lVar9 < *piVar1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"invalid magic number.",0x15);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"MMD: invalid magic number.","");
  std::runtime_error::runtime_error(prVar7,(string *)local_88);
  *(undefined ***)prVar7 = &PTR__runtime_error_00900168;
  __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PmxModel::Read(std::istream *stream)
	{
		char magic[4];
		stream->read((char*) magic, sizeof(char) * 4);
		if (magic[0] != 0x50 || magic[1] != 0x4d || magic[2] != 0x58 || magic[3] != 0x20)
		{
			std::cerr << "invalid magic number." << std::endl;
      throw DeadlyImportError("MMD: invalid magic number.");
    }
		stream->read((char*) &version, sizeof(float));
		if (version != 2.0f && version != 2.1f)
		{
			std::cerr << "this is not ver2.0 or ver2.1 but " << version << "." << std::endl;
            throw DeadlyImportError("MMD: this is not ver2.0 or ver2.1 but " + to_string(version));
    }
		this->setting.Read(stream);

		this->model_name = ReadString(stream, setting.encoding);
		this->model_english_name = ReadString(stream, setting.encoding);
		this->model_comment = ReadString(stream, setting.encoding);
		this->model_english_comment = ReadString(stream, setting.encoding);

		// read vertices
		stream->read((char*) &vertex_count, sizeof(int));
		this->vertices = mmd::make_unique<PmxVertex []>(vertex_count);
		for (int i = 0; i < vertex_count; i++)
		{
			vertices[i].Read(stream, &setting);
		}

		// read indices
		stream->read((char*) &index_count, sizeof(int));
		this->indices = mmd::make_unique<int []>(index_count);
		for (int i = 0; i < index_count; i++)
		{
			this->indices[i] = ReadIndex(stream, setting.vertex_index_size);
		}

		// read texture names
		stream->read((char*) &texture_count, sizeof(int));
		this->textures = mmd::make_unique<std::string []>(texture_count);
		for (int i = 0; i < texture_count; i++)
		{
			this->textures[i] = ReadString(stream, setting.encoding);
		}

		// read materials
		stream->read((char*) &material_count, sizeof(int));
		this->materials = mmd::make_unique<PmxMaterial []>(material_count);
		for (int i = 0; i < material_count; i++)
		{
			this->materials[i].Read(stream, &setting);
		}

		// read bones
		stream->read((char*) &this->bone_count, sizeof(int));
		this->bones = mmd::make_unique<PmxBone []>(this->bone_count);
		for (int i = 0; i < this->bone_count; i++)
		{
			this->bones[i].Read(stream, &setting);
		}

		// read morphs
		stream->read((char*) &this->morph_count, sizeof(int));
		this->morphs = mmd::make_unique<PmxMorph []>(this->morph_count);
		for (int i = 0; i < this->morph_count; i++)
		{
			this->morphs[i].Read(stream, &setting);
		}

		// read display frames
		stream->read((char*) &this->frame_count, sizeof(int));
		this->frames = mmd::make_unique<PmxFrame []>(this->frame_count);
		for (int i = 0; i < this->frame_count; i++)
		{
			this->frames[i].Read(stream, &setting);
		}

		// read rigid bodies
		stream->read((char*) &this->rigid_body_count, sizeof(int));
		this->rigid_bodies = mmd::make_unique<PmxRigidBody []>(this->rigid_body_count);
		for (int i = 0; i < this->rigid_body_count; i++)
		{
			this->rigid_bodies[i].Read(stream, &setting);
		}

		// read joints
		stream->read((char*) &this->joint_count, sizeof(int));
		this->joints = mmd::make_unique<PmxJoint []>(this->joint_count);
		for (int i = 0; i < this->joint_count; i++)
		{
			this->joints[i].Read(stream, &setting);
		}
	}